

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_movem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGContext_conflict2 *s_01;
  TCGv_i32 pTVar1;
  uint32_t uVar2;
  MemOp_conflict memop;
  TCGv_i32 pTVar3;
  TCGTemp *a1;
  TCGv_i32 addr;
  TCGTemp *pTVar4;
  TCGv_i32 *ppTVar5;
  uintptr_t o;
  ulong uVar6;
  uintptr_t o_2;
  long lVar7;
  uint mode;
  TCGv_i32 *ppTVar8;
  TCGContext_conflict2 *tcg_ctx_2;
  uint uVar9;
  uint reg0;
  bool bVar10;
  TCGv_i32 r [16];
  ushort local_e8;
  undefined8 auStack_b8 [17];
  
  s_00 = s->uc->tcg_ctx;
  uVar2 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  uVar9 = (uint)insn;
  mode = insn >> 3 & 7;
  reg0 = uVar9 & 7;
  if (mode < 5) {
    pTVar3 = s_00->cpu_aregs[reg0];
    switch(mode) {
    default:
switchD_006f7c52_caseD_0:
      gen_exception(s,(s->base).pc_next,3);
      return;
    case 2:
      break;
    case 3:
      if ((insn >> 10 & 1) == 0) goto switchD_006f7c52_caseD_0;
      break;
    case 4:
      if ((insn >> 10 & 1) != 0) goto switchD_006f7c52_caseD_0;
    }
  }
  else {
    pTVar3 = gen_lea_mode(env,s,mode,reg0,2 - (uint)((insn & 0x40) == 0));
    if (pTVar3 == s_00->NULL_QREG) goto switchD_006f7c52_caseD_0;
  }
  a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  addr = (TCGv_i32)((long)a1 - (long)s_00);
  if (pTVar3 != addr) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)a1,(TCGArg)(pTVar3 + (long)s_00));
  }
  pTVar3 = tcg_const_i32_m68k(s_00,((uVar9 & 0x40) >> 5) + 2);
  local_e8 = (ushort)uVar2;
  if ((insn >> 10 & 1) == 0) {
    memop = MO_BEUL - ((insn & 0x40) == 0);
    if (mode != 4) {
      ppTVar8 = s_00->cpu_dregs;
      uVar6 = 0;
      do {
        if ((local_e8 >> ((uint)uVar6 & 0x1f) & 1) != 0) {
          ppTVar5 = s_00->cpu_aregs + ((uint)uVar6 & 7);
          if (uVar6 < 8) {
            ppTVar5 = ppTVar8;
          }
          tcg_gen_qemu_st_i32_m68k
                    (s->uc->tcg_ctx,*ppTVar5,addr,(ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),
                     memop);
          tcg_gen_op3_m68k(s_00,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,
                           (TCGArg)(pTVar3 + (long)&s_00->pool_cur));
        }
        uVar6 = uVar6 + 1;
        ppTVar8 = ppTVar8 + 1;
      } while (uVar6 != 0x10);
      goto LAB_006f803c;
    }
    ppTVar8 = s_00->cpu_aregs + 7;
    uVar6 = 0xf;
    do {
      if ((short)(uVar2 << ((byte)uVar6 & 0x1f)) < 0) {
        tcg_gen_sub_i32(s_00,addr,addr,pTVar3);
        if (((~uVar9 & 7) + uVar6 == 0xf) && ((s->env->features & 0x4000) != 0)) {
          pTVar4 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
          tcg_gen_sub_i32(s_00,(TCGv_i32)((long)pTVar4 - (long)s_00),s_00->cpu_aregs[reg0],pTVar3);
          tcg_gen_qemu_st_i32_m68k
                    (s->uc->tcg_ctx,(TCGv_i32)((long)pTVar4 - (long)s_00),addr,
                     (ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),memop);
          tcg_temp_free_internal_m68k(s_00,pTVar4);
        }
        else {
          ppTVar5 = s_00->cpu_aregs + ((uint)uVar6 & 7);
          if (uVar6 < 8) {
            ppTVar5 = ppTVar8;
          }
          tcg_gen_qemu_st_i32_m68k
                    (s->uc->tcg_ctx,*ppTVar5,addr,(ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),
                     memop);
        }
      }
      ppTVar8 = ppTVar8 + -1;
      bVar10 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar10);
  }
  else {
    lVar7 = 0;
    do {
      if ((local_e8 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
        uVar9 = ((s->base).tb)->flags;
        s_01 = s->uc->tcg_ctx;
        pTVar4 = tcg_temp_new_internal_m68k(s_01,TCG_TYPE_I32,false);
        tcg_gen_qemu_ld_i32_m68k
                  (s_01,(TCGv_i32)((long)pTVar4 - (long)s_01),addr,(ulong)((uVar9 >> 0xd & 1) == 0),
                   (uint)((insn & 0x40) == 0) * 3 + MO_BEUL);
        auStack_b8[lVar7] = (TCGv_i32)((long)pTVar4 - (long)s_01);
        tcg_gen_op3_m68k(s_00,INDEX_op_add_i32,(TCGArg)a1,(TCGArg)a1,
                         (TCGArg)(pTVar3 + (long)&s_00->pool_cur));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    ppTVar8 = s_00->cpu_dregs;
    uVar6 = 0;
    do {
      if ((local_e8 >> ((uint)uVar6 & 0x1f) & 1) != 0) {
        ppTVar5 = s_00->cpu_aregs + ((uint)uVar6 & 7);
        if (uVar6 < 8) {
          ppTVar5 = ppTVar8;
        }
        pTVar1 = (TCGv_i32)auStack_b8[uVar6];
        if (*ppTVar5 != pTVar1) {
          tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(*ppTVar5 + (long)s_00),
                           (TCGArg)(pTVar1 + (long)&s_00->pool_cur));
        }
        tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar1 + (long)s_00));
      }
      uVar6 = uVar6 + 1;
      ppTVar8 = ppTVar8 + 1;
    } while (uVar6 != 0x10);
    if (mode != 3) goto LAB_006f803c;
  }
  if (s_00->cpu_aregs[reg0] != addr) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(s_00->cpu_aregs[reg0] + (long)s_00),(TCGArg)a1);
  }
LAB_006f803c:
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(addr + (long)s_00));
  return;
}

Assistant:

DISAS_INSN(movem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr, incr, tmp, r[16];
    int is_load = (insn & 0x0400) != 0;
    int opsize = (insn & 0x40) != 0 ? OS_LONG : OS_WORD;
    uint16_t mask = read_im16(env, s);
    int mode = extract32(insn, 3, 3);
    int reg0 = REG(insn, 0);
    int i;

    tmp = tcg_ctx->cpu_aregs[reg0];

    switch (mode) {
    case 0: /* data register direct */
    case 1: /* addr register direct */
    do_addr_fault:
        gen_addr_fault(s);
        return;

    case 2: /* indirect */
        break;

    case 3: /* indirect post-increment */
        if (!is_load) {
            /* post-increment is not allowed */
            goto do_addr_fault;
        }
        break;

    case 4: /* indirect pre-decrement */
        if (is_load) {
            /* pre-decrement is not allowed */
            goto do_addr_fault;
        }
        /*
         * We want a bare copy of the address reg, without any pre-decrement
         * adjustment, as gen_lea would provide.
         */
        break;

    default:
        tmp = gen_lea_mode(env, s, mode, reg0, opsize);
        if (IS_NULL_QREG(tmp)) {
            goto do_addr_fault;
        }
        break;
    }

    addr = tcg_temp_new(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx, addr, tmp);
    incr = tcg_const_i32(tcg_ctx, opsize_bytes(opsize));

    if (is_load) {
        /* memory to register */
        for (i = 0; i < 16; i++) {
            if (mask & (1 << i)) {
                r[i] = gen_load(s, opsize, addr, 1, IS_USER(s));
                tcg_gen_add_i32(tcg_ctx, addr, addr, incr);
            }
        }
        for (i = 0; i < 16; i++) {
            if (mask & (1 << i)) {
                tcg_gen_mov_i32(tcg_ctx, mreg(tcg_ctx, i), r[i]);
                tcg_temp_free(tcg_ctx, r[i]);
            }
        }
        if (mode == 3) {
            /* post-increment: movem (An)+,X */
            tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_aregs[reg0], addr);
        }
    } else {
        /* register to memory */
        if (mode == 4) {
            /* pre-decrement: movem X,-(An) */
            for (i = 15; i >= 0; i--) {
                if ((mask << i) & 0x8000) {
                    tcg_gen_sub_i32(tcg_ctx, addr, addr, incr);
                    if (reg0 + 8 == i &&
                        m68k_feature(s->env, M68K_FEATURE_EXT_FULL)) {
                        /*
                         * M68020+: if the addressing register is the
                         * register moved to memory, the value written
                         * is the initial value decremented by the size of
                         * the operation, regardless of how many actual
                         * stores have been performed until this point.
                         * M68000/M68010: the value is the initial value.
                         */
                        tmp = tcg_temp_new(tcg_ctx);
                        tcg_gen_sub_i32(tcg_ctx, tmp, tcg_ctx->cpu_aregs[reg0], incr);
                        gen_store(s, opsize, addr, tmp, IS_USER(s));
                        tcg_temp_free(tcg_ctx, tmp);
                    } else {
                        gen_store(s, opsize, addr, mreg(tcg_ctx, i), IS_USER(s));
                    }
                }
            }
            tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_aregs[reg0], addr);
        } else {
            for (i = 0; i < 16; i++) {
                if (mask & (1 << i)) {
                    gen_store(s, opsize, addr, mreg(tcg_ctx, i), IS_USER(s));
                    tcg_gen_add_i32(tcg_ctx, addr, addr, incr);
                }
            }
        }
    }

    tcg_temp_free(tcg_ctx, incr);
    tcg_temp_free(tcg_ctx, addr);
}